

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test5(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  long lVar5;
  pointer element;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_114;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_110;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v1;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> b;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38;
  
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::queue
            (&a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&b,"A",(allocator<char> *)&local_110)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_98,"AA",&local_111);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"ABC",&local_112);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"A",&local_113);
  __l._M_len = 4;
  __l._M_array = (iterator)&b;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&v1,__l,&local_114);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string(local_98 + lVar5 + -0x20);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  for (element = v1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      element !=
      v1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; element = element + 1) {
    CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push(&a,element);
  }
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::queue
            (&b,&a);
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::queue
            (&local_110);
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::queue
            (&local_38,&b);
  sVar3 = local_110.mSize;
  sVar2 = local_110.mCap;
  pbVar1 = local_110.mData;
  local_110.mCap = local_38.mCap;
  local_110.mSize = local_38.mSize;
  local_38.mCap = sVar2;
  local_38.mSize = sVar3;
  local_110.mData = local_38.mData;
  local_38.mData = pbVar1;
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~queue(&local_38);
  bVar4 = CP::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator==(&a,&b);
  if (bVar4) {
    bVar4 = CP::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator==(&b,&a);
    if (bVar4) {
      bVar4 = CP::
              queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator==(&a,&local_110);
      if (bVar4) {
        bVar4 = CP::
                queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator==(&local_110,&a);
        if (bVar4) {
          bVar4 = CP::
                  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator==(&b,&local_110);
          if (bVar4) {
            bVar4 = CP::
                    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator==(&local_110,&b);
            goto LAB_00102be4;
          }
        }
      }
    }
  }
  bVar4 = false;
LAB_00102be4:
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~queue(&local_110);
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~queue(&b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v1);
  CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~queue(&a);
  return bVar4;
}

Assistant:

bool test5() {
  CP::queue<std::string> a;
  std::vector<std::string> v1 = {"A","AA","ABC","A"};
  for (auto &x : v1) { a.push(x); }
  CP::queue<std::string> b(a);
  CP::queue<std::string> c;
  c = b;
  return
    ( ((a == b) == true)  && ((b == a) == true)) &&
    ( ((a == c) == true)  && ((c == a) == true)) &&
    ( ((b == c) == true)  && ((c == b) == true));
}